

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  void *ctx;
  ulong uVar12;
  long lVar13;
  int local_69c;
  glob_t globbuf;
  char prefix [500];
  char err [500];
  char pattern [500];
  
  pcVar6 = baseFilename(filename);
  uVar7 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserStructuredErrors(uVar7,testStructuredErrorHandler,0);
  lVar8 = xmlSchemaParse(uVar7);
  xmlSchemaFreeParserCtxt(uVar7);
  iVar1 = testErrorsSize;
  sVar9 = strlen(pcVar6);
  iVar2 = (int)sVar9;
  if (iVar2 - 500U < 0xfffffe11) {
    xmlSchemaFree(lVar8);
    iVar2 = -1;
  }
  else {
    iVar3 = iVar2 + -6;
    if (pcVar6[(long)iVar2 + -6] != '_') {
      iVar3 = iVar2 + -4;
    }
    if (pcVar6[(long)iVar3 + -2] == '_') {
      iVar3 = iVar3 + -2;
    }
    sVar9 = (size_t)iVar3;
    memcpy(prefix,pcVar6,sVar9);
    prefix[sVar9] = '\0';
    iVar2 = snprintf(pattern,499,"./test/schemas/%s_*.xml",prefix);
    if (0x1f2 < iVar2) {
      pattern[499] = '\0';
    }
    if (pcVar6[sVar9] == '_') {
      memcpy(prefix,pcVar6,sVar9 + 2);
      prefix[sVar9 + 2] = '\0';
    }
    globbuf.gl_offs = 0;
    glob64(pattern,8,(__errfunc *)0x0,(glob64_t *)&globbuf);
    iVar2 = 0;
    for (uVar12 = 0; uVar12 < globbuf.gl_pathc; uVar12 = uVar12 + 1) {
      testErrorsSize = iVar1;
      testErrors[iVar1] = '\0';
      pcVar6 = globbuf.gl_pathv[uVar12];
      pcVar10 = baseFilename(pcVar6);
      sVar9 = strlen(pcVar10);
      iVar3 = (int)sVar9;
      if ((iVar3 < 7) || (pcVar10[iVar3 - 6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar6);
      }
      else {
        iVar4 = snprintf(err,499,"result/schemas/%s_%c.err",prefix,
                         (ulong)(uint)(int)pcVar10[iVar3 - 5]);
        iVar3 = testErrorsSize;
        if (0x1f2 < iVar4) {
          err[499] = '\0';
        }
        nb_tests = nb_tests + 1;
        lVar13 = (long)testErrorsSize;
        local_69c = 0;
        for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
          testErrorsSize = iVar3;
          testErrors[lVar13] = '\0';
          iVar5 = iVar3;
          if (lVar8 != 0) {
            pvVar11 = (void *)xmlSchemaNewValidCtxt(lVar8);
            xmlSchemaSetValidStructuredErrors(pvVar11,testStructuredErrorHandler,0);
            if (iVar4 == 0) {
              ctx = (void *)xmlReadFile(pcVar6,0,options);
              if (ctx == (void *)0x0) {
                fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar6,filename);
                iVar2 = -1;
                goto LAB_0010a278;
              }
              iVar5 = xmlSchemaValidateDoc(pvVar11,ctx);
              xmlFreeDoc();
            }
            else {
              ctx = pvVar11;
              iVar5 = xmlSchemaValidateFile(pvVar11,pcVar6,options);
            }
            pcVar10 = "%s validation generated an internal error\n";
            if (0 < iVar5) {
              pcVar10 = "%s fails to validate\n";
            }
            if (iVar5 == 0) {
              pcVar10 = "%s validates\n";
            }
            testErrorHandler(ctx,pcVar10,pcVar6);
            xmlSchemaFreeValidCtxt(pvVar11);
            iVar5 = testErrorsSize;
          }
          iVar5 = compareFileMem(err,testErrors,iVar5);
          if (iVar5 != 0) {
            fprintf(_stderr,"Error for %s on %s failed\n",pcVar6,filename);
            local_69c = 1;
          }
        }
        if (local_69c != 0) {
          iVar2 = local_69c;
        }
      }
LAB_0010a278:
    }
    globfree64((glob64_t *)&globbuf);
    xmlSchemaFree(lVar8);
  }
  return iVar2;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserStructuredErrors(ctxt, testStructuredErrorHandler, NULL);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}

        nb_tests++;
        ret = schemasOneTest(filename, instance, err, options, schemas);
        if (ret != 0)
            res = ret;
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}